

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
::raw_hash_set(raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
               *this,raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                     *that,allocator_type *a)

{
  allocator_type *paVar1;
  bool bVar2;
  ctrl_t *pcVar3;
  hasher *__elements_1;
  key_equal *__elements_2;
  allocator_type *b;
  size_t *__a;
  size_t *__b;
  size_t n;
  iterator iVar4;
  pair<phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_bool>
  local_80;
  reference local_68;
  pair<const_int,_int> *elem;
  iterator __end0;
  iterator __begin0;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  *__range4;
  int local_24;
  allocator_type *local_20;
  allocator_type *a_local;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  *that_local;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  *this_local;
  
  local_20 = a;
  a_local = (allocator_type *)that;
  that_local = this;
  pcVar3 = EmptyGroup<std::is_same<phmap::priv::Alloc<std::pair<int_const,int>>,std::allocator<std::pair<int_const,int>>>>
                     ();
  this->ctrl_ = pcVar3;
  this->slots_ = (slot_type *)0x0;
  this->size_ = 0;
  this->capacity_ = 0;
  local_24 = 0;
  __elements_1 = hash_ref((raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                           *)a_local);
  __elements_2 = eq_ref((raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                         *)a_local);
  std::
  tuple<unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::
  tuple<int,_phmap::priv::StatefulTestingHash_&,_phmap::priv::StatefulTestingEqual_&,_const_phmap::priv::Alloc<std::pair<const_int,_int>_>_&,_true,_true>
            (&this->settings_,&local_24,__elements_1,__elements_2,local_20);
  paVar1 = local_20;
  b = alloc_ref((raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                 *)a_local);
  bVar2 = priv::operator==(paVar1,b);
  if (bVar2) {
    std::swap<signed_char*>(&this->ctrl_,(char **)a_local);
    std::swap<std::pair<int_const,int>**>(&this->slots_,(pair<const_int,_int> ***)(a_local + 1));
    std::swap<unsigned_long>(&this->size_,&a_local[2].id_);
    std::swap<unsigned_long>(&this->capacity_,&a_local[3].id_);
    __a = growth_left(this);
    __b = growth_left((raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                       *)a_local);
    std::swap<unsigned_long>(__a,__b);
    std::swap<phmap::priv::HashtablezInfoHandle>
              ((HashtablezInfoHandle *)&this->field_0x20,(HashtablezInfoHandle *)(a_local + 4));
  }
  else {
    n = size((raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
              *)a_local);
    reserve(this,n);
    paVar1 = a_local;
    iVar4 = begin((raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                   *)a_local);
    __end0.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)iVar4.ctrl_;
    iVar4 = end((raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                 *)paVar1);
    while( true ) {
      __end0.ctrl_ = (ctrl_t *)iVar4.field_1;
      elem = (pair<const_int,_int> *)iVar4.ctrl_;
      bVar2 = priv::operator!=((iterator *)&__end0.field_1,(iterator *)&elem);
      if (!bVar2) break;
      local_68 = iterator::operator*((iterator *)&__end0.field_1);
      insert<std::pair<const_int,_int>,_0,_0,_nullptr>(&local_80,this,local_68);
      iterator::operator++((iterator *)&__end0.field_1);
      iVar4.field_1.slot_ = (slot_type *)__end0.ctrl_;
      iVar4.ctrl_ = (ctrl_t *)elem;
    }
  }
  return;
}

Assistant:

raw_hash_set(raw_hash_set&& that, const allocator_type& a)
        : ctrl_(EmptyGroup<std_alloc_t>()),
          slots_(nullptr),
          size_(0),
          capacity_(0),
          settings_(0, that.hash_ref(), that.eq_ref(), a) {
        if (a == that.alloc_ref()) {
            std::swap(ctrl_, that.ctrl_);
            std::swap(slots_, that.slots_);
            std::swap(size_, that.size_);
            std::swap(capacity_, that.capacity_);
            std::swap(growth_left(), that.growth_left());
            std::swap(infoz_, that.infoz_);
        } else {
            reserve(that.size());
            // Note: this will copy elements of dense_set and unordered_set instead of
            // moving them. This can be fixed if it ever becomes an issue.
            for (auto& elem : that) insert(std::move(elem));
        }
    }